

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O0

void highbd_12_variance_sse2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,int w,int h,uint32_t *sse,
               int *sum,high_variance_fn_t var_fn,int block_size)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int sum0;
  uint sse0;
  int32_t sum_long;
  uint64_t sse_long;
  code *in_stack_00000018;
  int j;
  int i;
  int local_44;
  uint local_40;
  int local_3c;
  long local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_38 = 0;
  local_3c = 0;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < local_24; local_28 = i + local_28) {
    for (local_2c = 0; local_2c < local_20; local_2c = i + local_2c) {
      (*in_stack_00000018)
                (local_8 + (long)(local_c * local_28) * 2 + (long)local_2c * 2,local_c,
                 local_18 + (long)(local_1c * local_28) * 2 + (long)local_2c * 2,local_1c,&local_40,
                 &local_44);
      local_38 = (ulong)local_40 + local_38;
      local_3c = local_44 + local_3c;
    }
  }
  *(int *)sse_long = local_3c + 8 >> 4;
  *_sse0 = (int)((ulong)(local_38 + 0x80) >> 8);
  return;
}

Assistant:

static void highbd_12_variance_sse2(const uint16_t *src, int src_stride,
                                    const uint16_t *ref, int ref_stride, int w,
                                    int h, uint32_t *sse, int *sum,
                                    high_variance_fn_t var_fn, int block_size) {
  int i, j;
  uint64_t sse_long = 0;
  int32_t sum_long = 0;

  for (i = 0; i < h; i += block_size) {
    for (j = 0; j < w; j += block_size) {
      unsigned int sse0;
      int sum0;
      var_fn(src + src_stride * i + j, src_stride, ref + ref_stride * i + j,
             ref_stride, &sse0, &sum0);
      sse_long += sse0;
      sum_long += sum0;
    }
  }
  *sum = ROUND_POWER_OF_TWO(sum_long, 4);
  *sse = (uint32_t)ROUND_POWER_OF_TWO(sse_long, 8);
}